

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::avx::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  Scene *pSVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  float fVar29;
  float fVar32;
  float fVar33;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar34;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar44;
  undefined1 auVar37 [32];
  undefined1 auVar45 [36];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [36];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar60 [64];
  undefined1 auVar61 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [28];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_308;
  float local_304;
  RTCFilterFunctionNArguments local_300;
  float local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c4;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_2a0 [32];
  Scene *local_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar56 [64];
  
  pSVar20 = context->scene;
  pGVar5 = (pSVar20->geometries).items[sphere->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar23._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar23._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar30._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar30._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar36 = vunpcklps_avx(auVar23,auVar35);
  auVar23 = vunpckhps_avx(auVar23,auVar35);
  auVar26 = vunpcklps_avx(auVar30,auVar46);
  auVar30 = vunpckhps_avx(auVar30,auVar46);
  auVar35 = vunpcklps_avx(auVar36,auVar26);
  auVar36 = vunpckhps_avx(auVar36,auVar26);
  auVar26 = vunpcklps_avx(auVar23,auVar30);
  auVar53 = vunpckhps_avx(auVar23,auVar30);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  local_1a0 = local_190;
  auVar22 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 8),
                         *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).org.field_0 + 8),8);
  auVar22 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar9 = vrcpss_avx(auVar22,auVar22);
  auVar22 = ZEXT416((uint)(auVar9._0_4_ * (2.0 - auVar22._0_4_ * auVar9._0_4_)));
  auVar9 = vshufps_avx(auVar22,auVar22,0);
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar23 = vsubps_avx(auVar35,auVar51);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  auVar30 = vsubps_avx(auVar36,auVar52);
  fVar29 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar36._4_4_ = fVar29;
  auVar36._0_4_ = fVar29;
  auVar36._8_4_ = fVar29;
  auVar36._12_4_ = fVar29;
  auVar36._16_4_ = fVar29;
  auVar36._20_4_ = fVar29;
  auVar36._24_4_ = fVar29;
  auVar36._28_4_ = fVar29;
  auVar36 = vsubps_avx(auVar26,auVar36);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar60 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar62 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar64 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  fVar44 = fVar29 + 0.0 + 0.0;
  fVar29 = auVar9._0_4_;
  fVar34 = fVar29 * (fVar2 * auVar23._0_4_ + fVar3 * auVar30._0_4_ + fVar4 * auVar36._0_4_);
  fVar32 = auVar9._4_4_;
  fVar38 = fVar32 * (fVar2 * auVar23._4_4_ + fVar3 * auVar30._4_4_ + fVar4 * auVar36._4_4_);
  auVar11._4_4_ = fVar38;
  auVar11._0_4_ = fVar34;
  fVar33 = auVar9._8_4_;
  fVar39 = fVar33 * (fVar2 * auVar23._8_4_ + fVar3 * auVar30._8_4_ + fVar4 * auVar36._8_4_);
  auVar11._8_4_ = fVar39;
  fVar40 = auVar9._12_4_ *
           (fVar2 * auVar23._12_4_ + fVar3 * auVar30._12_4_ + fVar4 * auVar36._12_4_);
  auVar11._12_4_ = fVar40;
  fVar41 = fVar29 * (fVar2 * auVar23._16_4_ + fVar3 * auVar30._16_4_ + fVar4 * auVar36._16_4_);
  auVar11._16_4_ = fVar41;
  fVar42 = fVar32 * (fVar2 * auVar23._20_4_ + fVar3 * auVar30._20_4_ + fVar4 * auVar36._20_4_);
  auVar11._20_4_ = fVar42;
  fVar43 = fVar33 * (fVar2 * auVar23._24_4_ + fVar3 * auVar30._24_4_ + fVar4 * auVar36._24_4_);
  auVar11._24_4_ = fVar43;
  auVar11._28_4_ = fVar44;
  auVar26._4_4_ = fVar2 * fVar38;
  auVar26._0_4_ = fVar2 * fVar34;
  auVar26._8_4_ = fVar2 * fVar39;
  auVar26._12_4_ = fVar2 * fVar40;
  auVar26._16_4_ = fVar2 * fVar41;
  auVar26._20_4_ = fVar2 * fVar42;
  auVar26._24_4_ = fVar2 * fVar43;
  auVar26._28_4_ = 0;
  auVar58._0_4_ = fVar3 * fVar34;
  auVar58._4_4_ = fVar3 * fVar38;
  auVar58._8_4_ = fVar3 * fVar39;
  auVar58._12_4_ = fVar3 * fVar40;
  auVar58._16_4_ = fVar3 * fVar41;
  auVar58._20_4_ = fVar3 * fVar42;
  auVar58._28_36_ = in_ZMM7._28_36_;
  auVar58._24_4_ = fVar3 * fVar43;
  auVar56._0_4_ = fVar4 * fVar34;
  auVar56._4_4_ = fVar4 * fVar38;
  auVar56._8_4_ = fVar4 * fVar39;
  auVar56._12_4_ = fVar4 * fVar40;
  auVar56._16_4_ = fVar4 * fVar41;
  auVar56._20_4_ = fVar4 * fVar42;
  auVar56._28_36_ = in_ZMM8._28_36_;
  auVar56._24_4_ = fVar4 * fVar43;
  auVar26 = vsubps_avx(auVar23,auVar26);
  auVar65 = ZEXT3264(auVar26);
  auVar35 = vsubps_avx(auVar30,auVar58._0_32_);
  auVar66 = ZEXT3264(auVar35);
  auVar46 = vsubps_avx(auVar36,auVar56._0_32_);
  auVar58 = ZEXT3264(auVar46);
  auVar47._0_4_ =
       auVar26._0_4_ * auVar26._0_4_ + auVar35._0_4_ * auVar35._0_4_ + auVar46._0_4_ * auVar46._0_4_
  ;
  auVar47._4_4_ =
       auVar26._4_4_ * auVar26._4_4_ + auVar35._4_4_ * auVar35._4_4_ + auVar46._4_4_ * auVar46._4_4_
  ;
  auVar47._8_4_ =
       auVar26._8_4_ * auVar26._8_4_ + auVar35._8_4_ * auVar35._8_4_ + auVar46._8_4_ * auVar46._8_4_
  ;
  auVar47._12_4_ =
       auVar26._12_4_ * auVar26._12_4_ +
       auVar35._12_4_ * auVar35._12_4_ + auVar46._12_4_ * auVar46._12_4_;
  auVar47._16_4_ =
       auVar26._16_4_ * auVar26._16_4_ +
       auVar35._16_4_ * auVar35._16_4_ + auVar46._16_4_ * auVar46._16_4_;
  auVar47._20_4_ =
       auVar26._20_4_ * auVar26._20_4_ +
       auVar35._20_4_ * auVar35._20_4_ + auVar46._20_4_ * auVar46._20_4_;
  auVar47._24_4_ =
       auVar26._24_4_ * auVar26._24_4_ +
       auVar35._24_4_ * auVar35._24_4_ + auVar46._24_4_ * auVar46._24_4_;
  auVar47._28_4_ = auVar36._28_4_ + auVar36._28_4_ + auVar23._28_4_;
  auVar10._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar10._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar10._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar10._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar10._16_4_ = auVar53._16_4_ * auVar53._16_4_;
  auVar10._20_4_ = auVar53._20_4_ * auVar53._20_4_;
  auVar10._24_4_ = auVar53._24_4_ * auVar53._24_4_;
  auVar10._28_4_ = auVar53._28_4_;
  auVar23 = vcmpps_avx(auVar47,auVar10,2);
  auVar22 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar53._16_16_ = auVar22;
  auVar53._0_16_ = auVar22;
  auVar30 = vcvtdq2ps_avx(auVar53);
  auVar30 = vcmpps_avx(_DAT_01faff40,auVar30,1);
  auVar36 = auVar30 & auVar23;
  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar36 >> 0x7f,0) != '\0') ||
        (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar36 >> 0xbf,0) != '\0') ||
      (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar36[0x1f] < '\0') {
    auVar23 = vandps_avx(auVar23,auVar30);
    auVar30 = vsubps_avx(auVar10,auVar47);
    auVar12._4_4_ = fVar32 * auVar30._4_4_;
    auVar12._0_4_ = fVar29 * auVar30._0_4_;
    auVar12._8_4_ = fVar33 * auVar30._8_4_;
    auVar12._12_4_ = auVar9._12_4_ * auVar30._12_4_;
    auVar12._16_4_ = fVar29 * auVar30._16_4_;
    auVar12._20_4_ = fVar32 * auVar30._20_4_;
    auVar12._24_4_ = fVar33 * auVar30._24_4_;
    auVar12._28_4_ = auVar30._28_4_;
    auVar10 = vsqrtps_avx(auVar12);
    auVar68 = ZEXT3264(auVar10);
    auVar11 = vsubps_avx(auVar11,auVar10);
    auVar55._0_4_ = auVar10._0_4_ + fVar34;
    auVar55._4_4_ = auVar10._4_4_ + fVar38;
    auVar55._8_4_ = auVar10._8_4_ + fVar39;
    auVar55._12_4_ = auVar10._12_4_ + fVar40;
    auVar55._16_4_ = auVar10._16_4_ + fVar41;
    auVar55._20_4_ = auVar10._20_4_ + fVar42;
    auVar55._24_4_ = auVar10._24_4_ + fVar43;
    auVar55._28_4_ = auVar10._28_4_ + fVar44;
    auVar56 = ZEXT3264(auVar55);
    auVar22 = SUB3216(*(undefined1 (*) [32])((long)&(ray->super_RayK<1>).org.field_0 + 0xc),0);
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    auVar31._16_16_ = auVar22;
    auVar31._0_16_ = auVar22;
    auVar30 = vcmpps_avx(auVar31,auVar11,2);
    fVar29 = (ray->super_RayK<1>).tfar;
    auVar48._4_4_ = fVar29;
    auVar48._0_4_ = fVar29;
    auVar48._8_4_ = fVar29;
    auVar48._12_4_ = fVar29;
    auVar48._16_4_ = fVar29;
    auVar48._20_4_ = fVar29;
    auVar48._24_4_ = fVar29;
    auVar48._28_4_ = fVar29;
    auVar36 = vcmpps_avx(auVar11,auVar48,2);
    auVar30 = vandps_avx(auVar36,auVar30);
    auVar30 = vandps_avx(auVar30,auVar23);
    auVar69 = ZEXT3264(auVar30);
    auVar36 = vcmpps_avx(auVar31,auVar55,2);
    auVar53 = vcmpps_avx(auVar55,auVar48,2);
    auVar36 = vandps_avx(auVar53,auVar36);
    local_1c0 = vandps_avx(auVar36,auVar23);
    auVar36 = vorps_avx(auVar30,local_1c0);
    if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0x7f,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar36 >> 0xbf,0) != '\0') ||
        (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar36[0x1f] < '\0')
    {
      auVar37._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = -auVar10._8_4_;
      auVar37._12_4_ = -auVar10._12_4_;
      auVar37._16_4_ = -auVar10._16_4_;
      auVar37._20_4_ = -auVar10._20_4_;
      auVar37._24_4_ = -auVar10._24_4_;
      auVar37._28_4_ = -auVar10._28_4_;
      local_260 = vblendvps_avx(auVar55,auVar11,auVar30);
      auVar53 = vblendvps_avx(auVar10,auVar37,auVar30);
      auVar30 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      auVar28 = ZEXT3264(auVar30);
      fVar32 = auVar53._0_4_;
      fVar33 = auVar53._4_4_;
      auVar13._4_4_ = fVar2 * fVar33;
      auVar13._0_4_ = fVar2 * fVar32;
      fVar34 = auVar53._8_4_;
      auVar13._8_4_ = fVar2 * fVar34;
      fVar38 = auVar53._12_4_;
      auVar13._12_4_ = fVar2 * fVar38;
      fVar39 = auVar53._16_4_;
      auVar13._16_4_ = fVar2 * fVar39;
      fVar40 = auVar53._20_4_;
      auVar13._20_4_ = fVar2 * fVar40;
      fVar41 = auVar53._24_4_;
      auVar13._24_4_ = fVar2 * fVar41;
      auVar13._28_4_ = fVar29;
      auVar14._4_4_ = fVar3 * fVar33;
      auVar14._0_4_ = fVar3 * fVar32;
      auVar14._8_4_ = fVar3 * fVar34;
      auVar14._12_4_ = fVar3 * fVar38;
      auVar14._16_4_ = fVar3 * fVar39;
      auVar14._20_4_ = fVar3 * fVar40;
      auVar14._24_4_ = fVar3 * fVar41;
      auVar14._28_4_ = auVar23._28_4_;
      auVar15._4_4_ = fVar4 * fVar33;
      auVar15._0_4_ = fVar4 * fVar32;
      auVar15._8_4_ = fVar4 * fVar34;
      auVar15._12_4_ = fVar4 * fVar38;
      auVar15._16_4_ = fVar4 * fVar39;
      auVar15._20_4_ = fVar4 * fVar40;
      auVar15._24_4_ = fVar4 * fVar41;
      auVar15._28_4_ = auVar53._28_4_;
      local_240 = vsubps_avx(auVar13,auVar26);
      local_220 = vsubps_avx(auVar14,auVar35);
      local_200 = vsubps_avx(auVar15,auVar46);
      local_2a0 = auVar36;
      auVar49._8_4_ = 0x7f800000;
      auVar49._0_8_ = 0x7f8000007f800000;
      auVar49._12_4_ = 0x7f800000;
      auVar49._16_4_ = 0x7f800000;
      auVar49._20_4_ = 0x7f800000;
      auVar49._24_4_ = 0x7f800000;
      auVar49._28_4_ = 0x7f800000;
      local_80 = local_260;
      auVar23 = vblendvps_avx(auVar49,local_260,auVar36);
      auVar54 = ZEXT3264(auVar49);
      auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar26 = vminps_avx(auVar23,auVar26);
      auVar35 = vshufpd_avx(auVar26,auVar26,5);
      auVar26 = vminps_avx(auVar26,auVar35);
      auVar35 = vperm2f128_avx(auVar26,auVar26,1);
      auVar26 = vminps_avx(auVar26,auVar35);
      auVar23 = vcmpps_avx(auVar23,auVar26,0);
      auVar35 = auVar36 & auVar23;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar36 = vandps_avx(auVar23,auVar36);
      }
      auVar22 = auVar30._0_16_;
      uVar17 = vextractps_avx(auVar22,1);
      uVar18 = vmovmskps_avx(auVar36);
      uVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      auVar57 = ZEXT1664(auVar22);
LAB_00fc0c46:
      auVar30 = auVar58._0_32_;
      auVar35 = auVar66._0_32_;
      auVar36 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar50 = ZEXT436(auVar26._28_4_);
      auVar61 = auVar62._0_28_;
      auVar45 = ZEXT436(auVar23._28_4_);
      auVar67 = auVar68._0_28_;
      auVar59 = auVar60._0_28_;
      auVar46 = auVar69._0_32_;
      uVar21 = (ulong)uVar19;
      local_2b8 = *(uint *)(local_1a0 + uVar21 * 4);
      pGVar5 = (pSVar20->geometries).items[local_2b8].ptr;
      if ((pGVar5->mask & uVar17) == 0) {
        *(undefined4 *)(local_2a0 + uVar21 * 4) = 0;
        auVar45 = ZEXT436(auVar23._28_4_);
        auVar50 = ZEXT436(auVar26._28_4_);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar57 = ZEXT464((uint)*(float *)(local_260 + uVar21 * 4));
          (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar21 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_240 + uVar21 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_220 + uVar21 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_200 + uVar21 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar21];
          ray->geomID = local_2b8;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          auVar22 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
          uVar17 = (ray->super_RayK<1>).mask;
LAB_00fc0fa8:
          auVar23 = vandps_avx(auVar46,local_1c0);
          auVar22 = vshufps_avx(auVar22,auVar22,0);
          auVar25._16_16_ = auVar22;
          auVar25._0_16_ = auVar22;
          local_260 = auVar56._0_32_;
          auVar26 = vcmpps_avx(local_260,auVar25,2);
          auVar46 = auVar23 & auVar26;
          if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar46 >> 0x7f,0) == '\0') &&
                (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar46 >> 0xbf,0) == '\0') &&
              (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar46[0x1f]) {
            return;
          }
          auVar26 = vandps_avx(auVar26,auVar23);
          fVar29 = auVar67._0_4_;
          fVar2 = auVar67._4_4_;
          auVar16._4_4_ = auVar59._4_4_ * fVar2;
          auVar16._0_4_ = auVar59._0_4_ * fVar29;
          fVar3 = auVar67._8_4_;
          auVar16._8_4_ = auVar59._8_4_ * fVar3;
          fVar4 = auVar67._12_4_;
          auVar16._12_4_ = auVar59._12_4_ * fVar4;
          fVar32 = auVar67._16_4_;
          auVar16._16_4_ = auVar59._16_4_ * fVar32;
          fVar33 = auVar67._20_4_;
          auVar16._20_4_ = auVar59._20_4_ * fVar33;
          fVar34 = auVar67._24_4_;
          auVar16._24_4_ = auVar59._24_4_ * fVar34;
          auVar16._28_4_ = auVar23._28_4_;
          auVar60._0_4_ = auVar61._0_4_ * fVar29;
          auVar60._4_4_ = auVar61._4_4_ * fVar2;
          auVar60._8_4_ = auVar61._8_4_ * fVar3;
          auVar60._12_4_ = auVar61._12_4_ * fVar4;
          auVar60._16_4_ = auVar61._16_4_ * fVar32;
          auVar60._20_4_ = auVar61._20_4_ * fVar33;
          auVar60._24_4_ = auVar61._24_4_ * fVar34;
          auVar60._28_36_ = auVar45;
          auVar62._0_4_ = auVar63._0_4_ * fVar29;
          auVar62._4_4_ = auVar63._4_4_ * fVar2;
          auVar62._8_4_ = auVar63._8_4_ * fVar3;
          auVar62._12_4_ = auVar63._12_4_ * fVar4;
          auVar62._16_4_ = auVar63._16_4_ * fVar32;
          auVar62._20_4_ = auVar63._20_4_ * fVar33;
          auVar62._24_4_ = auVar63._24_4_ * fVar34;
          auVar62._28_36_ = auVar50;
          local_240 = vsubps_avx(auVar16,auVar36);
          local_220 = vsubps_avx(auVar60._0_32_,auVar35);
          local_200 = vsubps_avx(auVar62._0_32_,auVar30);
          pSVar20 = context->scene;
          local_2a0 = auVar26;
          auVar23 = vblendvps_avx(auVar54._0_32_,local_260,auVar26);
          auVar30 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar30 = vminps_avx(auVar23,auVar30);
          auVar36 = vshufpd_avx(auVar30,auVar30,5);
          auVar30 = vminps_avx(auVar30,auVar36);
          auVar36 = vperm2f128_avx(auVar30,auVar30,1);
          auVar30 = vminps_avx(auVar30,auVar36);
          auVar23 = vcmpps_avx(auVar23,auVar30,0);
          auVar30 = auVar26 & auVar23;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar26 = vandps_avx(auVar23,auVar26);
          }
          uVar18 = vmovmskps_avx(auVar26);
          uVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          do {
            uVar21 = (ulong)uVar19;
            local_2b8 = *(uint *)(local_1a0 + uVar21 * 4);
            pGVar5 = (pSVar20->geometries).items[local_2b8].ptr;
            if ((pGVar5->mask & uVar17) == 0) {
              *(undefined4 *)(local_2a0 + uVar21 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar21 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_240 + uVar21 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_220 + uVar21 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_200 + uVar21 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar21];
                ray->geomID = local_2b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_1c0._0_8_ = pSVar20;
              local_304 = auVar57._0_4_;
              local_1e0 = auVar56._0_32_;
              local_2d0 = *(float *)(local_240 + uVar21 * 4);
              local_2cc = *(undefined4 *)(local_220 + uVar21 * 4);
              local_2c8 = *(undefined4 *)(local_200 + uVar21 * 4);
              local_2c4 = 0;
              local_2bc = (sphere->primIDs).field_0.i[uVar21];
              local_2b4 = context->user->instID[0];
              local_2b0 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar21 * 4);
              local_308 = -1;
              local_300.valid = &local_308;
              local_300.geometryUserPtr = pGVar5->userPtr;
              local_300.context = context->user;
              local_300.ray = (RTCRayN *)ray;
              local_300.hit = (RTCHitN *)&local_2d0;
              local_300.N = 1;
              if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar5->intersectionFilterN)(&local_300), *local_300.valid != 0)) {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                    && ((*p_Var8)(&local_300), *local_300.valid == 0)))) goto LAB_00fc124c;
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_300.hit;
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_300.hit + 4);
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_300.hit + 8);
                *(float *)((long)local_300.ray + 0x3c) = *(float *)(local_300.hit + 0xc);
                *(float *)((long)local_300.ray + 0x40) = *(float *)(local_300.hit + 0x10);
                *(float *)((long)local_300.ray + 0x44) = *(float *)(local_300.hit + 0x14);
                *(float *)((long)local_300.ray + 0x48) = *(float *)(local_300.hit + 0x18);
                *(float *)((long)local_300.ray + 0x4c) = *(float *)(local_300.hit + 0x1c);
                *(float *)((long)local_300.ray + 0x50) = *(float *)(local_300.hit + 0x20);
              }
              else {
LAB_00fc124c:
                (ray->super_RayK<1>).tfar = local_304;
              }
              auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pSVar20 = (Scene *)local_1c0._0_8_;
              *(undefined4 *)(local_2a0 + uVar21 * 4) = 0;
              fVar29 = (ray->super_RayK<1>).tfar;
              auVar27._4_4_ = fVar29;
              auVar27._0_4_ = fVar29;
              auVar27._8_4_ = fVar29;
              auVar27._12_4_ = fVar29;
              auVar27._16_4_ = fVar29;
              auVar27._20_4_ = fVar29;
              auVar27._24_4_ = fVar29;
              auVar27._28_4_ = fVar29;
              auVar56 = ZEXT3264(local_1e0);
              auVar23 = vcmpps_avx(local_1e0,auVar27,2);
              local_2a0 = vandps_avx(auVar23,local_2a0);
              uVar17 = (ray->super_RayK<1>).mask;
              auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
            }
            if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2a0 >> 0x7f,0) == '\0') &&
                  (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2a0 >> 0xbf,0) == '\0') &&
                (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2a0[0x1f]) {
              return;
            }
            auVar23 = vblendvps_avx(auVar54._0_32_,auVar56._0_32_,local_2a0);
            auVar30 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar30 = vminps_avx(auVar23,auVar30);
            auVar36 = vshufpd_avx(auVar30,auVar30,5);
            auVar30 = vminps_avx(auVar30,auVar36);
            auVar36 = vperm2f128_avx(auVar30,auVar30,1);
            auVar30 = vminps_avx(auVar30,auVar36);
            auVar30 = vcmpps_avx(auVar23,auVar30,0);
            auVar36 = local_2a0 & auVar30;
            auVar23 = local_2a0;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              auVar23 = vandps_avx(auVar30,local_2a0);
            }
            uVar18 = vmovmskps_avx(auVar23);
            uVar19 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
          } while( true );
        }
        local_180 = auVar46;
        local_160 = auVar68._0_32_;
        local_140 = auVar30;
        local_120 = auVar35;
        local_100 = auVar36;
        local_e0 = auVar64._0_32_;
        local_c0 = auVar62._0_32_;
        local_a0 = auVar60._0_32_;
        local_304 = auVar57._0_4_;
        local_268 = pSVar20;
        local_1e0 = auVar56._0_32_;
        auVar45 = (undefined1  [36])0x0;
        auVar50 = (undefined1  [36])0x0;
        local_2d0 = *(float *)(local_240 + uVar21 * 4);
        local_2cc = *(undefined4 *)(local_220 + uVar21 * 4);
        local_2c8 = *(undefined4 *)(local_200 + uVar21 * 4);
        local_2c4 = 0;
        local_2bc = (sphere->primIDs).field_0.i[uVar21];
        local_2b4 = context->user->instID[0];
        local_2b0 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar21 * 4);
        local_308 = -1;
        local_300.valid = &local_308;
        local_300.geometryUserPtr = pGVar5->userPtr;
        local_300.context = context->user;
        local_300.ray = (RTCRayN *)ray;
        local_300.hit = (RTCHitN *)&local_2d0;
        local_300.N = 1;
        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fc0d96:
          p_Var8 = context->args->filter;
          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
            auVar45 = (undefined1  [36])0x0;
            auVar50 = (undefined1  [36])0x0;
            (*p_Var8)(&local_300);
            if (*local_300.valid == 0) goto LAB_00fc0e83;
          }
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.x = *(float *)local_300.hit;
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_300.hit + 4);
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_300.hit + 8);
          *(float *)((long)local_300.ray + 0x3c) = *(float *)(local_300.hit + 0xc);
          *(float *)((long)local_300.ray + 0x40) = *(float *)(local_300.hit + 0x10);
          *(float *)((long)local_300.ray + 0x44) = *(float *)(local_300.hit + 0x14);
          *(float *)((long)local_300.ray + 0x48) = *(float *)(local_300.hit + 0x18);
          *(float *)((long)local_300.ray + 0x4c) = *(float *)(local_300.hit + 0x1c);
          *(float *)((long)local_300.ray + 0x50) = *(float *)(local_300.hit + 0x20);
        }
        else {
          auVar45 = (undefined1  [36])0x0;
          auVar50 = (undefined1  [36])0x0;
          (*pGVar5->intersectionFilterN)(&local_300);
          if (*local_300.valid != 0) goto LAB_00fc0d96;
LAB_00fc0e83:
          (ray->super_RayK<1>).tfar = local_304;
        }
        pSVar20 = local_268;
        auVar56 = ZEXT3264(local_1e0);
        auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        auVar60 = ZEXT3264(local_a0);
        auVar62 = ZEXT3264(local_c0);
        auVar64 = ZEXT3264(local_e0);
        auVar65 = ZEXT3264(local_100);
        auVar66 = ZEXT3264(local_120);
        auVar58 = ZEXT3264(local_140);
        auVar68 = ZEXT3264(local_160);
        auVar69 = ZEXT3264(local_180);
        *(undefined4 *)(local_2a0 + uVar21 * 4) = 0;
        fVar29 = (ray->super_RayK<1>).tfar;
        auVar24._4_4_ = fVar29;
        auVar24._0_4_ = fVar29;
        auVar24._8_4_ = fVar29;
        auVar24._12_4_ = fVar29;
        auVar24._16_4_ = fVar29;
        auVar24._20_4_ = fVar29;
        auVar24._24_4_ = fVar29;
        auVar24._28_4_ = fVar29;
        auVar23 = vcmpps_avx(local_80,auVar24,2);
        local_2a0 = vandps_avx(auVar23,local_2a0);
        auVar28 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
        uVar17 = (ray->super_RayK<1>).mask;
        auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      auVar30 = auVar58._0_32_;
      auVar35 = auVar66._0_32_;
      auVar36 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar61 = auVar62._0_28_;
      auVar67 = auVar68._0_28_;
      auVar59 = auVar60._0_28_;
      auVar22 = auVar28._0_16_;
      auVar46 = auVar69._0_32_;
      if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_2a0 >> 0x7f,0) == '\0') &&
            (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_2a0 >> 0xbf,0) == '\0') &&
          (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_2a0[0x1f]) goto LAB_00fc0fa8;
      auVar23 = vblendvps_avx(auVar54._0_32_,local_80,local_2a0);
      auVar30 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar30 = vminps_avx(auVar23,auVar30);
      auVar36 = vshufpd_avx(auVar30,auVar30,5);
      auVar30 = vminps_avx(auVar30,auVar36);
      auVar36 = vperm2f128_avx(auVar30,auVar30,1);
      auVar26 = vminps_avx(auVar30,auVar36);
      auVar23 = vcmpps_avx(auVar23,auVar26,0);
      auVar36 = local_2a0 & auVar23;
      auVar30 = local_2a0;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0x7f,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0xbf,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar36[0x1f] < '\0') {
        auVar30 = vandps_avx(auVar23,local_2a0);
      }
      uVar18 = vmovmskps_avx(auVar30);
      uVar19 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      goto LAB_00fc0c46;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }